

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBroadphaseProxy.h
# Opt level: O0

bool __thiscall
btBroadphasePairSortPredicate::operator()
          (btBroadphasePairSortPredicate *this,btBroadphasePair *a,btBroadphasePair *b)

{
  bool local_3a;
  bool local_39;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int uidB1;
  int uidA1;
  int uidB0;
  int uidA0;
  btBroadphasePair *b_local;
  btBroadphasePair *a_local;
  btBroadphasePairSortPredicate *this_local;
  
  if (a->m_pProxy0 == (btBroadphaseProxy *)0x0) {
    local_2c = -1;
  }
  else {
    local_2c = a->m_pProxy0->m_uniqueId;
  }
  if (b->m_pProxy0 == (btBroadphaseProxy *)0x0) {
    local_30 = -1;
  }
  else {
    local_30 = b->m_pProxy0->m_uniqueId;
  }
  if (a->m_pProxy1 == (btBroadphaseProxy *)0x0) {
    local_34 = -1;
  }
  else {
    local_34 = a->m_pProxy1->m_uniqueId;
  }
  if (b->m_pProxy1 == (btBroadphaseProxy *)0x0) {
    local_38 = -1;
  }
  else {
    local_38 = b->m_pProxy1->m_uniqueId;
  }
  local_39 = true;
  if ((local_2c <= local_30) &&
     ((a->m_pProxy0 != b->m_pProxy0 || (local_39 = true, local_34 <= local_38)))) {
    local_3a = false;
    if ((a->m_pProxy0 == b->m_pProxy0) && (local_3a = false, a->m_pProxy1 == b->m_pProxy1)) {
      local_3a = b->m_algorithm < a->m_algorithm;
    }
    local_39 = local_3a;
  }
  return local_39;
}

Assistant:

bool operator() ( const btBroadphasePair& a, const btBroadphasePair& b ) const
		{
			const int uidA0 = a.m_pProxy0 ? a.m_pProxy0->m_uniqueId : -1;
			const int uidB0 = b.m_pProxy0 ? b.m_pProxy0->m_uniqueId : -1;
			const int uidA1 = a.m_pProxy1 ? a.m_pProxy1->m_uniqueId : -1;
			const int uidB1 = b.m_pProxy1 ? b.m_pProxy1->m_uniqueId : -1;

			 return uidA0 > uidB0 || 
				(a.m_pProxy0 == b.m_pProxy0 && uidA1 > uidB1) ||
				(a.m_pProxy0 == b.m_pProxy0 && a.m_pProxy1 == b.m_pProxy1 && a.m_algorithm > b.m_algorithm); 
		}